

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  Curl_handler *pCVar4;
  size_t authlen;
  void *pvVar5;
  ulong local_178;
  char *pcStack_168;
  int err;
  char *dedot;
  dynbuf enc_2;
  dynbuf enc_1;
  size_t qlen;
  dynbuf enc;
  char *hostname;
  char *p;
  int i;
  size_t hostlen;
  char *hostp;
  char *schemep;
  char *ptr;
  undefined1 local_b8 [7];
  _Bool uncpath;
  dynbuf host;
  size_t fraglen;
  ulong uStack_88;
  CURLUcode result;
  size_t urllen;
  size_t schemelen;
  char schemebuf [41];
  char *fragment;
  char *query;
  size_t pathlen;
  char *path;
  uint flags_local;
  CURLU *u_local;
  char *url_local;
  
  stack0xffffffffffffffb8 = (char *)0x0;
  urllen = 0;
  host.toobig = 0;
  Curl_dyn_init((dynbuf *)local_b8,8000000);
  fraglen._4_4_ = junkscan(url,&stack0xffffffffffffff78,flags);
  if (fraglen._4_4_ != CURLUE_OK) goto LAB_00a8ffe5;
  urllen = Curl_is_absolute_url(url,(char *)&schemelen,0x29,(flags & 0x204) != 0);
  if ((urllen == 0) || (iVar1 = strcmp((char *)&schemelen,"file"), iVar1 != 0)) {
    hostp = (char *)0x0;
    if (urllen == 0) {
      if ((flags & 0x204) == 0) {
        fraglen._4_4_ = CURLUE_BAD_SCHEME;
        goto LAB_00a8ffe5;
      }
      hostlen = (size_t)url;
      if ((flags & 4) != 0) {
        hostp = "https";
      }
    }
    else {
      p._4_4_ = 0;
      for (hostname = url + urllen + 1; *hostname == '/' && p._4_4_ < 4; hostname = hostname + 1) {
        p._4_4_ = p._4_4_ + 1;
      }
      hostp = (char *)&schemelen;
      pCVar4 = Curl_get_scheme_handler(hostp);
      if ((pCVar4 == (Curl_handler *)0x0) && ((flags & 8) == 0)) {
        fraglen._4_4_ = CURLUE_UNSUPPORTED_SCHEME;
        goto LAB_00a8ffe5;
      }
      if ((p._4_4_ < 1) || (3 < p._4_4_)) {
        fraglen._4_4_ = CURLUE_BAD_SLASHES;
        goto LAB_00a8ffe5;
      }
      hostlen = (size_t)hostname;
    }
    if (hostp != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(hostp);
      u->scheme = pcVar3;
      if (u->scheme == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_00a8ffe5;
      }
    }
    authlen = strcspn((char *)hostlen,"/?#");
    pathlen = hostlen + authlen;
    query = (char *)(uStack_88 - (pathlen - (long)url));
    if (authlen == 0) {
      if ((flags & 0x400) == 0) {
        fraglen._4_4_ = CURLUE_NO_HOST;
        goto LAB_00a8ffe5;
      }
      CVar2 = Curl_dyn_add((dynbuf *)local_b8,"");
      if (CVar2 != CURLE_OK) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_00a8ffe5;
      }
    }
    else {
      fraglen._4_4_ =
           parse_authority(u,(char *)hostlen,authlen,flags,(dynbuf *)local_b8,urllen != 0);
      if (fraglen._4_4_ != CURLUE_OK) goto LAB_00a8ffe5;
      if (((flags & 0x200) != 0) && (hostp == (char *)0x0)) {
        enc.toobig = (size_t)Curl_dyn_ptr((dynbuf *)local_b8);
        iVar1 = curl_strnequal((char *)enc.toobig,"ftp.",4);
        if (iVar1 == 0) {
          iVar1 = curl_strnequal((char *)enc.toobig,"dict.",5);
          if (iVar1 == 0) {
            iVar1 = curl_strnequal((char *)enc.toobig,"ldap.",5);
            if (iVar1 == 0) {
              iVar1 = curl_strnequal((char *)enc.toobig,"imap.",5);
              if (iVar1 == 0) {
                iVar1 = curl_strnequal((char *)enc.toobig,"smtp.",5);
                if (iVar1 == 0) {
                  iVar1 = curl_strnequal((char *)enc.toobig,"pop3.",5);
                  if (iVar1 == 0) {
                    hostp = "http";
                  }
                  else {
                    hostp = "pop3";
                  }
                }
                else {
                  hostp = "smtp";
                }
              }
              else {
                hostp = "imap";
              }
            }
            else {
              hostp = "ldap";
            }
          }
          else {
            hostp = "dict";
          }
        }
        else {
          hostp = "ftp";
        }
        pcVar3 = (*Curl_cstrdup)(hostp);
        u->scheme = pcVar3;
        if (u->scheme == (char *)0x0) {
          fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
          goto LAB_00a8ffe5;
        }
      }
    }
  }
  else {
    if (uStack_88 < 7) {
      fraglen._4_4_ = CURLUE_BAD_FILE_URL;
      goto LAB_00a8ffe5;
    }
    pathlen = (size_t)(url + 5);
    query = (char *)(uStack_88 - 5);
    pcVar3 = (*Curl_cstrdup)("file");
    u->scheme = pcVar3;
    if (u->scheme == (char *)0x0) {
      fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
      goto LAB_00a8ffe5;
    }
    if ((*(char *)pathlen == '/') && (url[6] == '/')) {
      schemep = url + 7;
      if ((*schemep != '/') &&
         ((((*schemep < 'a' || ('z' < *schemep)) && ((*schemep < 'A' || ('Z' < *schemep)))) ||
          (((url[8] != ':' && (url[8] != '|')) ||
           ((url[9] != '/' && ((url[9] != '\\' && (url[9] != '\0')))))))))) {
        iVar1 = curl_strnequal(schemep,"localhost/",10);
        if ((iVar1 == 0) && (iVar1 = curl_strnequal(schemep,"127.0.0.1/",10), iVar1 == 0)) {
          fraglen._4_4_ = CURLUE_BAD_FILE_URL;
          goto LAB_00a8ffe5;
        }
        schemep = url + 0x10;
      }
      pathlen = (size_t)schemep;
      query = (char *)(uStack_88 - ((long)schemep - (long)url));
    }
    Curl_dyn_reset((dynbuf *)local_b8);
    if (((((*(char *)pathlen == '/') &&
          ((('`' < *(char *)(pathlen + 1) && (*(char *)(pathlen + 1) < '{')) ||
           (('@' < *(char *)(pathlen + 1) && (*(char *)(pathlen + 1) < '[')))))) &&
         ((*(char *)(pathlen + 2) == ':' || (*(char *)(pathlen + 2) == '|')))) &&
        ((*(char *)(pathlen + 3) == '/' ||
         ((*(char *)(pathlen + 3) == '\\' || (*(char *)(pathlen + 3) == '\0')))))) ||
       ((((('`' < *(char *)pathlen && (*(char *)pathlen < '{')) ||
          (('@' < *(char *)pathlen && (*(char *)pathlen < '[')))) &&
         ((*(char *)(pathlen + 1) == ':' || (*(char *)(pathlen + 1) == '|')))) &&
        (((*(char *)(pathlen + 2) == '/' || (*(char *)(pathlen + 2) == '\\')) ||
         (*(char *)(pathlen + 2) == '\0')))))) {
      fraglen._4_4_ = CURLUE_BAD_FILE_URL;
      goto LAB_00a8ffe5;
    }
  }
  register0x00000000 = strchr((char *)pathlen,0x23);
  if (register0x00000000 != (char *)0x0) {
    host.toobig = (long)query - ((long)register0x00000000 - pathlen);
    if (1 < host.toobig) {
      if ((flags & 0x80) == 0) {
        pcVar3 = (char *)Curl_memdup0(register0x00000000 + 1,host.toobig - 1);
        u->fragment = pcVar3;
        if (u->fragment == (char *)0x0) {
          fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
          goto LAB_00a8ffe5;
        }
      }
      else {
        Curl_dyn_init((dynbuf *)&qlen,8000000);
        fraglen._4_4_ =
             urlencode_str((dynbuf *)&qlen,stack0xffffffffffffffb8 + 1,host.toobig - 1,true,false);
        if (fraglen._4_4_ != CURLUE_OK) goto LAB_00a8ffe5;
        pcVar3 = Curl_dyn_ptr((dynbuf *)&qlen);
        u->fragment = pcVar3;
      }
    }
    query = query + -host.toobig;
  }
  pvVar5 = memchr((void *)pathlen,0x3f,(size_t)query);
  if (pvVar5 != (void *)0x0) {
    if (stack0xffffffffffffffb8 == (char *)0x0) {
      local_178 = (long)query - ((long)pvVar5 - pathlen);
    }
    else {
      local_178 = (long)stack0xffffffffffffffb8 - (long)pvVar5;
    }
    query = query + -local_178;
    if (local_178 < 2) {
      pcVar3 = (*Curl_cstrdup)("");
      u->query = pcVar3;
      if (u->query == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_00a8ffe5;
      }
    }
    else if ((flags & 0x80) == 0) {
      pcVar3 = (char *)Curl_memdup0((char *)((long)pvVar5 + 1),local_178 - 1);
      u->query = pcVar3;
      if (u->query == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_00a8ffe5;
      }
    }
    else {
      Curl_dyn_init((dynbuf *)&enc_2.toobig,8000000);
      fraglen._4_4_ =
           urlencode_str((dynbuf *)&enc_2.toobig,(char *)((long)pvVar5 + 1),local_178 - 1,true,true)
      ;
      if (fraglen._4_4_ != CURLUE_OK) goto LAB_00a8ffe5;
      pcVar3 = Curl_dyn_ptr((dynbuf *)&enc_2.toobig);
      u->query = pcVar3;
    }
  }
  if ((query != (char *)0x0) && ((flags & 0x80) != 0)) {
    Curl_dyn_init((dynbuf *)&dedot,8000000);
    fraglen._4_4_ = urlencode_str((dynbuf *)&dedot,(char *)pathlen,(size_t)query,true,false);
    if (fraglen._4_4_ != CURLUE_OK) goto LAB_00a8ffe5;
    query = (char *)Curl_dyn_len((dynbuf *)&dedot);
    pathlen = (size_t)Curl_dyn_ptr((dynbuf *)&dedot);
    u->path = (char *)pathlen;
  }
  if ((char *)0x1 < query) {
    if (u->path == (char *)0x0) {
      pcVar3 = (char *)Curl_memdup0((char *)pathlen,(size_t)query);
      u->path = pcVar3;
      if (u->path == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_00a8ffe5;
      }
      pathlen = (size_t)u->path;
    }
    else if ((flags & 0x80) != 0) {
      u->path[(long)query] = '\0';
    }
    if ((flags & 0x10) == 0) {
      iVar1 = dedotdotify((char *)pathlen,(size_t)query,&stack0xfffffffffffffe98);
      if (iVar1 != 0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
LAB_00a8ffe5:
        Curl_dyn_free((dynbuf *)local_b8);
        free_urlhandle(u);
        return fraglen._4_4_;
      }
      if (pcStack_168 != (char *)0x0) {
        (*Curl_cfree)(u->path);
        u->path = pcStack_168;
      }
    }
  }
  pcVar3 = Curl_dyn_ptr((dynbuf *)local_b8);
  u->host = pcVar3;
  return CURLUE_OK;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  const char *path;
  size_t pathlen;
  char *query = NULL;
  char *fragment = NULL;
  char schemebuf[MAX_SCHEME_LEN + 1];
  size_t schemelen = 0;
  size_t urllen;
  CURLUcode result = CURLUE_OK;
  size_t fraglen = 0;
  struct dynbuf host;

  DEBUGASSERT(url);

  Curl_dyn_init(&host, CURL_MAX_INPUT_LENGTH);

  result = junkscan(url, &urllen, flags);
  if(result)
    goto fail;

  schemelen = Curl_is_absolute_url(url, schemebuf, sizeof(schemebuf),
                                   flags & (CURLU_GUESS_SCHEME|
                                            CURLU_DEFAULT_SCHEME));

  /* handle the file: scheme */
  if(schemelen && !strcmp(schemebuf, "file")) {
    bool uncpath = FALSE;
    if(urllen <= 6) {
      /* file:/ is not enough to actually be a complete file: URL */
      result = CURLUE_BAD_FILE_URL;
      goto fail;
    }

    /* path has been allocated large enough to hold this */
    path = (char *)&url[5];
    pathlen = urllen - 5;

    u->scheme = strdup("file");
    if(!u->scheme) {
      result = CURLUE_OUT_OF_MEMORY;
      goto fail;
    }

    /* Extra handling URLs with an authority component (i.e. that start with
     * "file://")
     *
     * We allow omitted hostname (e.g. file:/<path>) -- valid according to
     * RFC 8089, but not the (current) WHAT-WG URL spec.
     */
    if(path[0] == '/' && path[1] == '/') {
      /* swallow the two slashes */
      const char *ptr = &path[2];

      /*
       * According to RFC 8089, a file: URL can be reliably dereferenced if:
       *
       *  o it has no/blank hostname, or
       *
       *  o the hostname matches "localhost" (case-insensitively), or
       *
       *  o the hostname is a FQDN that resolves to this machine, or
       *
       *  o it is an UNC String transformed to an URI (Windows only, RFC 8089
       *    Appendix E.3).
       *
       * For brevity, we only consider URLs with empty, "localhost", or
       * "127.0.0.1" hostnames as local, otherwise as an UNC String.
       *
       * Additionally, there is an exception for URLs with a Windows drive
       * letter in the authority (which was accidentally omitted from RFC 8089
       * Appendix E, but believe me, it was meant to be there. --MK)
       */
      if(ptr[0] != '/' && !STARTS_WITH_URL_DRIVE_PREFIX(ptr)) {
        /* the URL includes a host name, it must match "localhost" or
           "127.0.0.1" to be valid */
        if(checkprefix("localhost/", ptr) ||
           checkprefix("127.0.0.1/", ptr)) {
          ptr += 9; /* now points to the slash after the host */
        }
        else {
#if defined(_WIN32)
          size_t len;

          /* the host name, NetBIOS computer name, can not contain disallowed
             chars, and the delimiting slash character must be appended to the
             host name */
          path = strpbrk(ptr, "/\\:*?\"<>|");
          if(!path || *path != '/') {
            result = CURLUE_BAD_FILE_URL;
            goto fail;
          }

          len = path - ptr;
          if(len) {
            CURLcode code = Curl_dyn_addn(&host, ptr, len);
            if(code) {
              result = cc2cu(code);
              goto fail;
            }
            uncpath = TRUE;
          }

          ptr -= 2; /* now points to the // before the host in UNC */
#else
          /* Invalid file://hostname/, expected localhost or 127.0.0.1 or
             none */
          result = CURLUE_BAD_FILE_URL;
          goto fail;
#endif
        }
      }

      path = ptr;
      pathlen = urllen - (ptr - url);
    }

    if(!uncpath)
      /* no host for file: URLs by default */
      Curl_dyn_reset(&host);

#if !defined(_WIN32) && !defined(MSDOS) && !defined(__CYGWIN__)
    /* Don't allow Windows drive letters when not in Windows.
     * This catches both "file:/c:" and "file:c:" */
    if(('/' == path[0] && STARTS_WITH_URL_DRIVE_PREFIX(&path[1])) ||
       STARTS_WITH_URL_DRIVE_PREFIX(path)) {
      /* File drive letters are only accepted in MSDOS/Windows */
      result = CURLUE_BAD_FILE_URL;
      goto fail;
    }
#else
    /* If the path starts with a slash and a drive letter, ditch the slash */
    if('/' == path[0] && STARTS_WITH_URL_DRIVE_PREFIX(&path[1])) {
      /* This cannot be done with strcpy, as the memory chunks overlap! */
      path++;
      pathlen--;
    }
#endif

  }
  else {
    /* clear path */
    const char *schemep = NULL;
    const char *hostp;
    size_t hostlen;

    if(schemelen) {
      int i = 0;
      const char *p = &url[schemelen + 1];
      while((*p == '/') && (i < 4)) {
        p++;
        i++;
      }

      schemep = schemebuf;
      if(!Curl_get_scheme_handler(schemep) &&
         !(flags & CURLU_NON_SUPPORT_SCHEME)) {
        result = CURLUE_UNSUPPORTED_SCHEME;
        goto fail;
      }

      if((i < 1) || (i > 3)) {
        /* less than one or more than three slashes */
        result = CURLUE_BAD_SLASHES;
        goto fail;
      }
      hostp = p; /* host name starts here */
    }
    else {
      /* no scheme! */

      if(!(flags & (CURLU_DEFAULT_SCHEME|CURLU_GUESS_SCHEME))) {
        result = CURLUE_BAD_SCHEME;
        goto fail;
      }
      if(flags & CURLU_DEFAULT_SCHEME)
        schemep = DEFAULT_SCHEME;

      /*
       * The URL was badly formatted, let's try without scheme specified.
       */
      hostp = url;
    }

    if(schemep) {
      u->scheme = strdup(schemep);
      if(!u->scheme) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }

    /* find the end of the host name + port number */
    hostlen = strcspn(hostp, "/?#");
    path = &hostp[hostlen];

    /* this pathlen also contains the query and the fragment */
    pathlen = urllen - (path - url);
    if(hostlen) {

      result = parse_authority(u, hostp, hostlen, flags, &host, schemelen);
      if(result)
        goto fail;

      if((flags & CURLU_GUESS_SCHEME) && !schemep) {
        const char *hostname = Curl_dyn_ptr(&host);
        /* legacy curl-style guess based on host name */
        if(checkprefix("ftp.", hostname))
          schemep = "ftp";
        else if(checkprefix("dict.", hostname))
          schemep = "dict";
        else if(checkprefix("ldap.", hostname))
          schemep = "ldap";
        else if(checkprefix("imap.", hostname))
          schemep = "imap";
        else if(checkprefix("smtp.", hostname))
          schemep = "smtp";
        else if(checkprefix("pop3.", hostname))
          schemep = "pop3";
        else
          schemep = "http";

        u->scheme = strdup(schemep);
        if(!u->scheme) {
          result = CURLUE_OUT_OF_MEMORY;
          goto fail;
        }
      }
    }
    else if(flags & CURLU_NO_AUTHORITY) {
      /* allowed to be empty. */
      if(Curl_dyn_add(&host, "")) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
    else {
      result = CURLUE_NO_HOST;
      goto fail;
    }
  }

  fragment = strchr(path, '#');
  if(fragment) {
    fraglen = pathlen - (fragment - path);
    if(fraglen > 1) {
      /* skip the leading '#' in the copy but include the terminating null */
      if(flags & CURLU_URLENCODE) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
        result = urlencode_str(&enc, fragment + 1, fraglen - 1, TRUE, FALSE);
        if(result)
          goto fail;
        u->fragment = Curl_dyn_ptr(&enc);
      }
      else {
        u->fragment = Curl_memdup0(fragment + 1, fraglen - 1);
        if(!u->fragment) {
          result = CURLUE_OUT_OF_MEMORY;
          goto fail;
        }
      }
    }
    /* after this, pathlen still contains the query */
    pathlen -= fraglen;
  }

  query = memchr(path, '?', pathlen);
  if(query) {
    size_t qlen = fragment ? (size_t)(fragment - query) :
      pathlen - (query - path);
    pathlen -= qlen;
    if(qlen > 1) {
      if(flags & CURLU_URLENCODE) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
        /* skip the leading question mark */
        result = urlencode_str(&enc, query + 1, qlen - 1, TRUE, TRUE);
        if(result)
          goto fail;
        u->query = Curl_dyn_ptr(&enc);
      }
      else {
        u->query = Curl_memdup0(query + 1, qlen - 1);
        if(!u->query) {
          result = CURLUE_OUT_OF_MEMORY;
          goto fail;
        }
      }
    }
    else {
      /* single byte query */
      u->query = strdup("");
      if(!u->query) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
  }

  if(pathlen && (flags & CURLU_URLENCODE)) {
    struct dynbuf enc;
    Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
    result = urlencode_str(&enc, path, pathlen, TRUE, FALSE);
    if(result)
      goto fail;
    pathlen = Curl_dyn_len(&enc);
    path = u->path = Curl_dyn_ptr(&enc);
  }

  if(pathlen <= 1) {
    /* there is no path left or just the slash, unset */
    path = NULL;
  }
  else {
    if(!u->path) {
      u->path = Curl_memdup0(path, pathlen);
      if(!u->path) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
      path = u->path;
    }
    else if(flags & CURLU_URLENCODE)
      /* it might have encoded more than just the path so cut it */
      u->path[pathlen] = 0;

    if(!(flags & CURLU_PATH_AS_IS)) {
      /* remove ../ and ./ sequences according to RFC3986 */
      char *dedot;
      int err = dedotdotify((char *)path, pathlen, &dedot);
      if(err) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
      if(dedot) {
        free(u->path);
        u->path = dedot;
      }
    }
  }

  u->host = Curl_dyn_ptr(&host);

  return result;
fail:
  Curl_dyn_free(&host);
  free_urlhandle(u);
  return result;
}